

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.h
# Opt level: O0

string * get_host_name_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  utsname buf;
  allocator local_18f;
  utsname local_18e;
  
  iVar1 = uname(&local_18e);
  if (iVar1 != 0) {
    local_18e.nodename[0] = '\0';
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_18e.nodename,&local_18f);
  std::allocator<char>::~allocator((allocator<char> *)&local_18f);
  return in_RDI;
}

Assistant:

std::string get_host_name() {
  struct utsname buf;
  if (0 != uname(&buf)) {
    *buf.nodename = '\0';
  }
  return std::string(buf.nodename);
}